

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

CF2_F16Dot16 cf2_hintmap_map(CF2_HintMap hintmap,CF2_F16Dot16 csCoord)

{
  bool bVar1;
  FT_Int32 FVar2;
  uint local_20;
  FT_UFast i;
  CF2_F16Dot16 csCoord_local;
  CF2_HintMap hintmap_local;
  
  if ((hintmap->count == 0) || (hintmap->hinted == '\0')) {
    hintmap_local._4_4_ = FT_MulFix_x86_64(csCoord,hintmap->scale);
  }
  else {
    local_20 = hintmap->lastIndex;
    while( true ) {
      bVar1 = false;
      if (local_20 < hintmap->count - 1) {
        bVar1 = hintmap->edge[local_20 + 1].csCoord <= csCoord;
      }
      if (!bVar1) break;
      local_20 = local_20 + 1;
    }
    while( true ) {
      bVar1 = false;
      if (local_20 != 0) {
        bVar1 = csCoord < hintmap->edge[local_20].csCoord;
      }
      if (!bVar1) break;
      local_20 = local_20 - 1;
    }
    hintmap->lastIndex = local_20;
    if ((local_20 == 0) && (csCoord < hintmap->edge[0].csCoord)) {
      FVar2 = FT_MulFix_x86_64(csCoord - hintmap->edge[0].csCoord,hintmap->scale);
      hintmap_local._4_4_ = FVar2 + hintmap->edge[0].dsCoord;
    }
    else {
      FVar2 = FT_MulFix_x86_64(csCoord - hintmap->edge[local_20].csCoord,
                               hintmap->edge[local_20].scale);
      hintmap_local._4_4_ = FVar2 + hintmap->edge[local_20].dsCoord;
    }
  }
  return hintmap_local._4_4_;
}

Assistant:

static CF2_Fixed
  cf2_hintmap_map( CF2_HintMap  hintmap,
                   CF2_Fixed    csCoord )
  {
    if ( hintmap->count == 0 || ! hintmap->hinted )
    {
      /* there are no hints; use uniform scale and zero offset */
      return FT_MulFix( csCoord, hintmap->scale );
    }
    else
    {
      /* start linear search from last hit */
      CF2_UInt  i = hintmap->lastIndex;


      FT_ASSERT( hintmap->lastIndex < CF2_MAX_HINT_EDGES );

      /* search up */
      while ( i < hintmap->count - 1                  &&
              csCoord >= hintmap->edge[i + 1].csCoord )
        i += 1;

      /* search down */
      while ( i > 0 && csCoord < hintmap->edge[i].csCoord )
        i -= 1;

      hintmap->lastIndex = i;

      if ( i == 0 && csCoord < hintmap->edge[0].csCoord )
      {
        /* special case for points below first edge: use uniform scale */
        return ADD_INT32( FT_MulFix( SUB_INT32( csCoord,
                                                hintmap->edge[0].csCoord ),
                                     hintmap->scale ),
                          hintmap->edge[0].dsCoord );
      }
      else
      {
        /*
         * Note: entries with duplicate csCoord are allowed.
         * Use edge[i], the highest entry where csCoord >= entry[i].csCoord
         */
        return ADD_INT32( FT_MulFix( SUB_INT32( csCoord,
                                                hintmap->edge[i].csCoord ),
                                     hintmap->edge[i].scale ),
                          hintmap->edge[i].dsCoord );
      }
    }
  }